

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,ReturnStmt *node)

{
  pointer pEVar1;
  ostream *this_00;
  ReturnStmt *node_local;
  PrettyPrinter *this_local;
  
  std::operator<<((ostream *)&std::cout,"return ");
  pEVar1 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::operator->(&node->m_expr);
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  this_00 = std::operator<<((ostream *)&std::cout,";");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::ReturnStmt *node) {
    std::cout << "return ";
    node->m_expr->accept(this);
    std::cout << ";" << std::endl;
}